

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

size_t Array_calcSizeBinary(void *src,size_t length,UA_DataType *type)

{
  UA_calcSizeBinarySignature p_Var1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if ((type->field_0x25 & 4) == 0) {
    uVar2 = 0x19;
    if ((type->field_0x25 & 1) != 0) {
      uVar2 = (ulong)type->typeIndex;
    }
    if (length == 0) {
      sVar4 = 4;
    }
    else {
      p_Var1 = calcSizeBinaryJumpTable[uVar2];
      sVar4 = 4;
      do {
        sVar3 = (*p_Var1)(src,type);
        sVar4 = sVar4 + sVar3;
        src = (void *)((long)src + (ulong)type->memSize);
        length = length - 1;
      } while (length != 0);
    }
  }
  else {
    sVar4 = type->memSize * length + 4;
  }
  return sVar4;
}

Assistant:

static size_t
Array_calcSizeBinary(const void *src, size_t length, const UA_DataType *type) {
    size_t s = 4; // length
    if(type->overlayable) {
        s += type->memSize * length;
        return s;
    }
    uintptr_t ptr = (uintptr_t)src;
    size_t encode_index = type->builtin ? type->typeIndex : UA_BUILTIN_TYPES_COUNT;
    for(size_t i = 0; i < length; ++i) {
        s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, type);
        ptr += type->memSize;
    }
    return s;
}